

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigBase *this,istream *input)

{
  ulong uVar1;
  char cVar2;
  short sVar3;
  uint uVar4;
  pointer pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  pointer pcVar6;
  bool bVar7;
  byte bVar8;
  char cVar9;
  char cVar10;
  bool bVar11;
  int iVar12;
  istream *piVar13;
  size_t sVar14;
  void *pvVar15;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var16;
  size_type sVar17;
  ulong uVar18;
  ulong __n_00;
  size_t sVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  bool bVar21;
  undefined8 uVar22;
  _Alloc_hider _Var23;
  undefined8 uVar24;
  undefined8 in_R9;
  char *__data;
  size_type sVar25;
  size_type __n;
  ConfigBase *pCVar26;
  char *pcVar27;
  pointer pbVar28;
  string multiline;
  string item;
  string line;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  string name;
  string currentSection;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it_1;
  string buffer;
  string previousSection;
  string line_sep_chars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  citems;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  ConfigBase *local_308;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *local_300;
  uint local_2f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  ulong local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  uint local_290;
  int local_28c;
  int local_288;
  int local_284;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  undefined1 *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  pointer local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  string local_210;
  uint local_1ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  char *local_168;
  size_t local_160;
  char local_158;
  char cStack_157;
  char cStack_156;
  undefined1 uStack_155;
  undefined4 uStack_154;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [5];
  string local_b0 [2];
  string local_70;
  string local_50;
  
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0._M_string_length = 0;
  local_2f0.field_2._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"default","");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"default","");
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar2 = this->arrayStart;
  local_290 = (uint)cVar2;
  cVar9 = this->arrayEnd;
  local_284 = (int)cVar9;
  if (cVar9 == ']' && cVar2 == '[') {
    uVar22 = CONCAT71((int7)((ulong)in_R9 >> 8),this->arraySeparator == ',');
  }
  else {
    if (((local_290 & 0xdf) == 0) && (cVar2 == cVar9)) {
      uVar22 = 0;
      local_284 = 0x5d;
      bVar8 = 1;
      local_290 = 0x5b;
      goto LAB_00238d92;
    }
    uVar22 = 0;
  }
  bVar8 = 0;
LAB_00238d92:
  cVar2 = this->arraySeparator;
  cVar9 = ',';
  if (cVar2 != ' ') {
    cVar9 = cVar2;
  }
  if (bVar8 == 0) {
    cVar9 = cVar2;
  }
  local_158 = this->parentSeparatorChar;
  cStack_157 = this->commentChar;
  cStack_156 = this->valueDelimiter;
  local_168 = &local_158;
  local_160 = 3;
  uStack_155 = 0;
  local_28c = (int)cVar9;
  local_1ec = (uint)CONCAT71((int7)((ulong)uVar22 >> 8),(byte)uVar22 | bVar8) ^ 1;
  local_288 = 0;
  local_2f4 = 0;
  local_308 = this;
LAB_00238e0f:
  pCVar26 = local_308;
  cVar2 = (char)input;
  cVar9 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar2);
  piVar13 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)input,(string *)&local_210,cVar9);
  if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) {
    iVar12 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260
                     ,"default");
    if (iVar12 != 0) {
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      local_280._M_string_length = 0;
      local_280.field_2._M_local_buf[0] = '\0';
      std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                (__return_storage_ptr__);
      detail::generate_parents
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_348,&local_260,(string *)&local_280,pCVar26->parentSeparatorChar);
      pCVar5 = (__return_storage_ptr__->
               super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_318._M_allocated_capacity =
           (size_type)
           pCVar5[-1].parents.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_328._M_allocated_capacity =
           (size_type)
           pCVar5[-1].parents.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_328._8_8_ =
           pCVar5[-1].parents.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pCVar5[-1].parents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_348._M_dataplus._M_p;
      pCVar5[-1].parents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_348._M_string_length;
      pCVar5[-1].parents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_348.field_2._M_allocated_capacity;
      local_348._M_dataplus._M_p = (pointer)0x0;
      local_348._M_string_length = 0;
      local_348.field_2._M_allocated_capacity = 0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_328);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
      pCVar5 = (__return_storage_ptr__->
               super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &pCVar5[-1].name,0,pCVar5[-1].name._M_string_length,"--",2);
      pCVar5 = (__return_storage_ptr__->
               super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar18 = (long)pCVar5[-1].parents.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)pCVar5[-1].parents.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      while (0x20 < uVar18) {
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                  (__return_storage_ptr__,pCVar5 + -1);
        pCVar5 = (__return_storage_ptr__->
                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pbVar28 = pCVar5[-1].parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pCVar5[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar28 + -1;
        pcVar6 = pbVar28[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &pbVar28[-1].field_2) {
          operator_delete(pcVar6,pbVar28[-1].field_2._M_allocated_capacity + 1);
        }
        pCVar5 = (__return_storage_ptr__->
                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar18 = (long)pCVar5[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)pCVar5[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,
                        CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                 local_280.field_2._M_local_buf[0]) + 1);
      }
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,
                      CONCAT44(uStack_154,
                               CONCAT13(uStack_155,
                                        CONCAT12(cStack_156,CONCAT11(cStack_157,local_158)))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                               local_210.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,
                      CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                               local_2f0.field_2._M_local_buf[0]) + 1);
    }
    return __return_storage_ptr__;
  }
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  detail::trim_copy((string *)&local_328,&local_210);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_2f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_allocated_capacity != &local_318) {
    operator_delete((void *)local_328._M_allocated_capacity,
                    (ulong)(local_318._M_allocated_capacity + 1));
  }
  sVar17 = local_2f0._M_string_length;
  if (2 < local_2f0._M_string_length) {
    iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0
                     ,0,3,"\"\"\"");
    if ((iVar12 == 0) ||
       (iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2f0,0,3,"\'\'\'"), iVar12 == 0)) {
      cVar9 = *local_2f0._M_dataplus._M_p;
      do {
        cVar10 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar2);
        piVar13 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)input,(string *)&local_2f0,cVar10);
        if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) break;
        local_328._M_allocated_capacity =
             (size_type)(local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        local_348._M_dataplus._M_p = local_2f0._M_dataplus._M_p;
        ::std::
        __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                  (&local_2c8,&local_328,&local_348);
        local_2f0._M_string_length =
             (long)local_2c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)local_2f0._M_dataplus._M_p;
        *(char *)local_2c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start = '\0';
        _Var16 = ::std::
                 __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                           (local_2f0._M_dataplus._M_p,
                            local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        if (local_2f0._M_dataplus._M_p + local_2f0._M_string_length == _Var16._M_current) {
          local_2f0._M_string_length = 0;
          _Var23._M_p = local_2f0._M_dataplus._M_p;
        }
        else {
          sVar17 = (long)_Var16._M_current - (long)local_2f0._M_dataplus._M_p;
          if ((local_2f0._M_string_length != sVar17 && sVar17 != 0) &&
             (sVar19 = local_2f0._M_string_length - sVar17, sVar19 != 0)) {
            if (sVar19 == 1) {
              *local_2f0._M_dataplus._M_p = local_2f0._M_dataplus._M_p[sVar17];
            }
            else {
              memmove(local_2f0._M_dataplus._M_p,local_2f0._M_dataplus._M_p + sVar17,sVar19);
            }
          }
          local_2f0._M_string_length = local_2f0._M_string_length - sVar17;
          _Var23._M_p = (pointer)(local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        }
        *_Var23._M_p = '\0';
      } while ((((local_2f0._M_string_length < 3) ||
                (local_2f0._M_dataplus._M_p[local_2f0._M_string_length - 1] != cVar9)) ||
               (local_2f0._M_dataplus._M_p[local_2f0._M_string_length - 2] != cVar9)) ||
              (local_2f0._M_dataplus._M_p[local_2f0._M_string_length - 3] != cVar9));
      goto LAB_00238ec1;
    }
    cVar9 = *local_2f0._M_dataplus._M_p;
    if ((cVar9 == '#') || (cVar9 == ';')) goto LAB_00238ec1;
    if ((cVar9 == '[') && (local_2f0._M_dataplus._M_p[local_2f0._M_string_length - 1] == ']')) {
      iVar12 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_260,"default");
      if (iVar12 != 0) {
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                  (__return_storage_ptr__);
        detail::generate_parents
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_348,&local_260,(string *)&local_280,local_308->parentSeparatorChar);
        pCVar5 = (__return_storage_ptr__->
                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        local_318._M_allocated_capacity =
             (size_type)
             pCVar5[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_328._M_allocated_capacity =
             (size_type)
             pCVar5[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_328._8_8_ =
             pCVar5[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pCVar5[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_348._M_dataplus._M_p;
        pCVar5[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_348._M_string_length;
        pCVar5[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_348.field_2._M_allocated_capacity;
        local_348._M_dataplus._M_p = (pointer)0x0;
        local_348._M_string_length = 0;
        local_348.field_2._M_allocated_capacity = 0;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_328);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_348);
        pCVar5 = (__return_storage_ptr__->
                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &pCVar5[-1].name,0,pCVar5[-1].name._M_string_length,"--",2);
      }
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328,
                 &local_2f0,1,sVar17 - 2);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_allocated_capacity != &local_318) {
        operator_delete((void *)local_328._M_allocated_capacity,
                        (ulong)(local_318._M_allocated_capacity + 1));
      }
      if (((1 < local_260._M_string_length) && (*local_260._M_dataplus._M_p == '[')) &&
         (local_260._M_dataplus._M_p[local_260._M_string_length - 1] == ']')) {
        local_300 = __return_storage_ptr__;
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260,1
                   ,local_260._M_string_length - 2);
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328);
        __return_storage_ptr__ = local_300;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_allocated_capacity != &local_318) {
          operator_delete((void *)local_328._M_allocated_capacity,
                          (ulong)(local_318._M_allocated_capacity + 1));
          __return_storage_ptr__ = local_300;
        }
      }
      local_230 = &local_220;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_260._M_dataplus._M_p,
                 local_260._M_dataplus._M_p + local_260._M_string_length);
      ::std::
      transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                (local_230,local_230->_M_local_buf + (long)&local_228->_M_dataplus,local_230);
      if (local_230 == &local_220) {
        local_318._8_8_ = local_220._8_8_;
        local_328._M_allocated_capacity = (size_type)&local_318;
      }
      else {
        local_328._M_allocated_capacity = (size_type)local_230;
      }
      local_318._M_allocated_capacity._1_7_ = local_220._M_allocated_capacity._1_7_;
      local_318._M_local_buf[0] = local_220._M_local_buf[0];
      local_328._8_8_ = local_228;
      local_228 = (pointer)0x0;
      local_220._M_local_buf[0] = '\0';
      local_230 = &local_220;
      iVar12 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_328,"default");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_allocated_capacity != &local_318) {
        operator_delete((void *)local_328._M_allocated_capacity,
                        (ulong)(local_318._M_allocated_capacity + 1));
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,
                        CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]) +
                        1);
      }
      if (iVar12 == 0) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260,0
                   ,local_260._M_string_length,"default",7);
      }
      else {
        detail::checkParentSegments
                  (__return_storage_ptr__,&local_260,local_308->parentSeparatorChar);
      }
      if ((local_260._M_string_length == local_1e8._M_string_length) &&
         ((local_260._M_string_length == 0 ||
          (iVar12 = bcmp(local_260._M_dataplus._M_p,local_1e8._M_dataplus._M_p,
                         local_260._M_string_length), iVar12 == 0)))) {
        local_288 = local_288 + 1;
        local_2f4 = 0;
      }
      else {
        local_288 = 0;
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260);
        local_2f4 = 0;
      }
      goto LAB_00238ec1;
    }
    if (cVar9 == local_308->commentChar) goto LAB_00238ec1;
    sVar17 = 0xffffffffffffffff;
    local_300 = __return_storage_ptr__;
    if (local_2f0._M_string_length != 0) {
      uVar18 = 0;
      do {
        sVar25 = local_2f0._M_string_length;
        if (((byte)local_2f0._M_dataplus._M_p[uVar18] - 0x22 < 0x3f) &&
           ((0x4000000000000021U >>
             ((ulong)((byte)local_2f0._M_dataplus._M_p[uVar18] - 0x22) & 0x3f) & 1) != 0)) {
          uVar18 = 0;
          goto LAB_002394f6;
        }
        uVar18 = uVar18 + 1;
      } while (local_2f0._M_string_length != uVar18);
      uVar18 = 0;
      goto LAB_0023974a;
    }
    goto LAB_00238f95;
  }
  goto LAB_00238ec1;
LAB_002394f6:
  do {
    sVar19 = local_160;
    pcVar27 = local_168;
    _Var23._M_p = local_2f0._M_dataplus._M_p;
    bVar8 = local_2f0._M_dataplus._M_p[uVar18];
    if ((bVar8 - 0x22 < 0x3f) && ((0x4000000000000021U >> ((ulong)(bVar8 - 0x22) & 0x3f) & 1) != 0))
    {
      sVar14 = detail::close_sequence((string *)&local_2f0,uVar18,bVar8);
      uVar18 = sVar14 + 1;
      sVar25 = local_2f0._M_string_length;
    }
    else {
      if ((bVar8 == local_308->valueDelimiter) || (bVar8 == local_308->commentChar)) {
        uVar18 = uVar18 - 1;
        break;
      }
      if (((bVar8 == 9) || (bVar8 == 0x20)) || (bVar8 == local_308->parentSeparatorChar)) {
        uVar18 = uVar18 + 1;
      }
      else {
        if (local_160 == 0) {
          uVar18 = 0xffffffffffffffff;
          break;
        }
        while (pvVar15 = memchr(pcVar27,(int)_Var23._M_p[uVar18],sVar19), pvVar15 == (void *)0x0) {
          uVar18 = uVar18 + 1;
          if (sVar25 <= uVar18) {
            uVar18 = 0xffffffffffffffff;
            goto LAB_0023974a;
          }
        }
      }
    }
  } while (uVar18 < sVar25);
LAB_0023974a:
  _Var23._M_p = local_2f0._M_dataplus._M_p;
  uVar1 = uVar18 + 1;
  sVar17 = 0xffffffffffffffff;
  __n_00 = 0xffffffffffffffff;
  if (uVar1 <= sVar25 && sVar25 - uVar1 != 0) {
    pvVar15 = memchr(local_2f0._M_dataplus._M_p + uVar1,(int)local_308->valueDelimiter,
                     sVar25 - uVar1);
    __n_00 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)_Var23._M_p;
  }
  _Var23._M_p = local_2f0._M_dataplus._M_p;
  if (uVar18 <= sVar25 && sVar25 - uVar18 != 0) {
    local_2d0 = __n_00;
    pvVar15 = memchr(local_2f0._M_dataplus._M_p + uVar18,(int)local_308->commentChar,sVar25 - uVar18
                    );
    sVar17 = -(ulong)(pvVar15 == (void *)0x0) | (long)pvVar15 - (long)_Var23._M_p;
    __n_00 = local_2d0;
  }
  pCVar26 = local_308;
  if ((__n_00 == 0xffffffffffffffff) || (local_2d0 = sVar17, sVar17 < __n_00)) {
LAB_00238f95:
    pCVar26 = local_308;
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_348,&local_2f0,0,sVar17);
    detail::trim_copy((string *)&local_328,(string *)&local_348);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_280,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_allocated_capacity != &local_318) {
      operator_delete((void *)local_328._M_allocated_capacity,
                      (ulong)(local_318._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,
                      (ulong)(local_348.field_2._M_allocated_capacity + 1));
    }
    local_328._M_allocated_capacity = (size_type)&local_318;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"true","");
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8,
               &local_328,&local_308);
    goto LAB_00239036;
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_348,&local_2f0,0,__n_00);
  detail::trim_copy((string *)&local_328,(string *)&local_348);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_280,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_allocated_capacity != &local_318) {
    operator_delete((void *)local_328._M_allocated_capacity,
                    (ulong)(local_318._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,(ulong)(local_348.field_2._M_allocated_capacity + 1))
    ;
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_348,&local_2f0,__n_00 + 1,0xffffffffffffffff);
  detail::trim_copy((string *)&local_328,(string *)&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,(ulong)(local_348.field_2._M_allocated_capacity + 1))
    ;
  }
  iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_328,0,3,"\'\'\'");
  if (iVar12 == 0) {
LAB_00239e77:
    local_2d0 = CONCAT71(local_2d0._1_7_,*(char *)local_328._M_allocated_capacity);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_348,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
               __n_00 + 1,0xffffffffffffffff);
    from_config();
    _Var16 = ::std::
             __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                       ();
    if ((char *)(local_328._M_allocated_capacity + local_328._8_8_) == _Var16._M_current) {
      local_328._8_8_ = (pointer)0x0;
      uVar22 = local_328._M_allocated_capacity;
    }
    else {
      pbVar28 = (pointer)(_Var16._M_current + -local_328._M_allocated_capacity);
      if (((pointer)local_328._8_8_ != pbVar28 && pbVar28 != (pointer)0x0) &&
         (sVar19 = local_328._8_8_ - (long)pbVar28, sVar19 != 0)) {
        pcVar27 = (char *)((long)&(pbVar28->_M_dataplus)._M_p + local_328._M_allocated_capacity);
        if (sVar19 == 1) {
          *(char *)local_328._M_allocated_capacity = *pcVar27;
        }
        else {
          memmove((void *)local_328._M_allocated_capacity,pcVar27,sVar19);
        }
      }
      local_328._8_8_ = local_328._8_8_ - (long)pbVar28;
      uVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&(((pointer)local_328._8_8_)->_M_dataplus)._M_p +
                  local_328._M_allocated_capacity);
    }
    *(char *)uVar22 = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328,0,3);
    bVar11 = true;
    if ((pointer)local_328._8_8_ == (pointer)0x0) {
LAB_0023a1ef:
      bVar7 = false;
LAB_0023a1f2:
      bVar21 = true;
    }
    else {
      if (((char *)(local_328._M_allocated_capacity - 1))[local_328._8_8_] == '\\') {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328);
        bVar7 = true;
        goto LAB_0023a1f2;
      }
      if (((((char *)(local_328._M_allocated_capacity - 1))[local_328._8_8_] != (char)local_2d0 ||
            (ulong)local_328._8_8_ < (pointer)0x3) ||
          (((char *)(local_328._M_allocated_capacity - 2))[local_328._8_8_] != (char)local_2d0)) ||
         (((char *)(local_328._M_allocated_capacity - 3))[local_328._8_8_] != (char)local_2d0))
      goto LAB_0023a1ef;
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328);
      bVar7 = false;
      bVar21 = false;
      if ((char)local_2d0 == '\"') {
        detail::remove_escaped_characters(&local_70,(string *)&local_328);
        from_config();
        bVar7 = false;
        bVar21 = false;
      }
    }
    do {
      if (!bVar21) break;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      local_348._M_string_length = 0;
      local_348.field_2._M_allocated_capacity =
           local_348.field_2._M_allocated_capacity & 0xffffffffffffff00;
      cVar9 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar2);
      piVar13 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)input,(string *)&local_348,cVar9);
      uVar4 = *(uint *)(piVar13 + *(long *)(*(long *)piVar13 + -0x18) + 0x20);
      bVar21 = true;
      if ((uVar4 & 5) == 0) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_2f0,&local_348);
        local_2c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f0._M_dataplus._M_p;
        ::std::
        __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                  (&local_240,&local_2c8,&local_238);
        local_2f0._M_string_length = (long)local_240 - (long)local_2f0._M_dataplus._M_p;
        *local_240 = 0;
        if (((local_2f0._M_string_length < 3) ||
            (local_2f0._M_dataplus._M_p[local_2f0._M_string_length - 1] != (char)local_2d0)) ||
           ((local_2f0._M_dataplus._M_p[local_2f0._M_string_length - 2] != (char)local_2d0 ||
            (local_2f0._M_dataplus._M_p[local_2f0._M_string_length - 3] != (char)local_2d0)))) {
          if (bVar7) {
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)(local_348._M_dataplus._M_p + local_348._M_string_length);
            local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_348._M_dataplus._M_p;
            ::std::
            __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                      (&local_240,&local_2c8,&local_238);
            local_348._M_string_length = (size_type)(local_240 + -(long)local_348._M_dataplus._M_p);
            *local_240 = 0;
            _Var16 = ::std::
                     __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                               (local_348._M_dataplus._M_p,
                                local_348._M_dataplus._M_p + local_348._M_string_length);
            if (local_348._M_dataplus._M_p + local_348._M_string_length == _Var16._M_current) {
              local_348._M_string_length = 0;
              _Var23._M_p = local_348._M_dataplus._M_p;
            }
            else {
              pcVar27 = _Var16._M_current + -(long)local_348._M_dataplus._M_p;
              if (((char *)local_348._M_string_length != pcVar27 && pcVar27 != (char *)0x0) &&
                 (sVar19 = local_348._M_string_length - (long)pcVar27, sVar19 != 0)) {
                if (sVar19 == 1) {
                  *local_348._M_dataplus._M_p = local_348._M_dataplus._M_p[(long)pcVar27];
                }
                else {
                  memmove(local_348._M_dataplus._M_p,local_348._M_dataplus._M_p + (long)pcVar27,
                          sVar19);
                }
              }
              local_348._M_string_length = local_348._M_string_length + -(long)pcVar27;
              _Var23._M_p = (pointer)(local_348._M_dataplus._M_p + local_348._M_string_length);
            }
            *_Var23._M_p = '\0';
          }
          else if ((!bVar11) || ((pointer)local_328._8_8_ != (pointer)0x0)) {
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_328,'\n');
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_string_length ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
LAB_0023a48a:
            bVar7 = false;
          }
          else {
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_348._M_string_length;
            if ((local_348._M_dataplus._M_p + -1)[local_348._M_string_length] != '\\')
            goto LAB_0023a48a;
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back(&local_348);
            bVar7 = true;
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_348._M_string_length;
          }
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328,
                    local_348._M_dataplus._M_p,(size_type)paVar20);
          bVar11 = false;
        }
        else {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back(&local_2f0);
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back(&local_2f0);
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back(&local_2f0);
          if (bVar7) {
            _Var16 = ::std::
                     __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                               (local_2f0._M_dataplus._M_p,
                                local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
            if (local_2f0._M_dataplus._M_p + local_2f0._M_string_length == _Var16._M_current) {
              local_2f0._M_string_length = 0;
              _Var23._M_p = local_2f0._M_dataplus._M_p;
            }
            else {
              uVar18 = (long)_Var16._M_current - (long)local_2f0._M_dataplus._M_p;
              if ((local_2f0._M_string_length != uVar18 && uVar18 != 0) &&
                 (sVar19 = local_2f0._M_string_length - uVar18, sVar19 != 0)) {
                if (sVar19 == 1) {
                  *local_2f0._M_dataplus._M_p = local_2f0._M_dataplus._M_p[uVar18];
                }
                else {
                  memmove(local_2f0._M_dataplus._M_p,local_2f0._M_dataplus._M_p + uVar18,sVar19);
                }
              }
              local_2f0._M_string_length = local_2f0._M_string_length - uVar18;
              _Var23._M_p = (pointer)(local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
            }
            *_Var23._M_p = '\0';
          }
          else if ((!bVar11) || ((pointer)local_328._8_8_ != (pointer)0x0)) {
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_328,'\n');
          }
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328,
                    local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
          if (((pointer)local_328._8_8_ != (pointer)0x0) &&
             (((char *)(local_328._M_allocated_capacity - 1))[local_328._8_8_] == '\n')) {
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328
                    );
          }
          if ((char)local_2d0 == '\"') {
            detail::remove_escaped_characters(local_b0,(string *)&local_328);
            from_config();
          }
          bVar11 = false;
          bVar21 = false;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,
                        (ulong)(local_348.field_2._M_allocated_capacity + 1));
      }
    } while ((uVar4 & 5) == 0);
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_328._M_allocated_capacity,
               (char *)(local_328._8_8_ + local_328._M_allocated_capacity));
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8,
               &local_348,&local_328);
LAB_0023a5c6:
    uVar22 = local_348.field_2._M_allocated_capacity;
    uVar24 = local_348._M_dataplus._M_p;
    pCVar26 = local_308;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
LAB_0023a5dd:
      operator_delete((void *)uVar24,(ulong)((long)&(((pointer)uVar22)->_M_dataplus)._M_p + 1));
    }
  }
  else {
    iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328
                     ,0,3,"\"\"\"");
    if (local_2d0 == 0xffffffffffffffff || iVar12 == 0) {
      if (iVar12 == 0) goto LAB_00239e77;
    }
    else {
      local_188._M_allocated_capacity = (size_type)&local_178;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,local_328._M_allocated_capacity,
                 (char *)(local_328._8_8_ + local_328._M_allocated_capacity));
      detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_108,(string *)&local_188,pCVar26->commentChar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_allocated_capacity != &local_178) {
        operator_delete((void *)local_188._M_allocated_capacity,local_178._M_allocated_capacity + 1)
        ;
      }
      detail::trim_copy(&local_50,(string *)local_108[0]._0_8_);
      from_config();
    }
    uVar24 = local_328._8_8_;
    uVar22 = local_328._M_allocated_capacity;
    if (((ulong)local_328._8_8_ < (pointer)0x2) ||
       (local_290 != (int)*(char *)local_328._M_allocated_capacity)) {
      if ((pointer)local_328._8_8_ != (pointer)0x0 && (char)local_1ec == '\0') {
        pvVar15 = memchr((void *)local_328._M_allocated_capacity,local_28c,local_328._8_8_);
        if ((long)pvVar15 - uVar22 == -1 || pvVar15 == (void *)0x0) {
          pvVar15 = memchr((void *)uVar22,0x20,uVar24);
          if ((long)pvVar15 - uVar22 == -1 || pvVar15 == (void *)0x0) goto LAB_00239ab7;
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c8,uVar22,(char *)(uVar24 + uVar22));
          detail::split_up(&local_2c8,&local_1c8,'\0');
          local_348.field_2._M_allocated_capacity =
               (size_type)
               local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_348._M_string_length =
               (size_type)
               local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_348._M_dataplus._M_p =
               (pointer)local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          pCVar26 = local_308;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_2c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_2c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_2c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_348);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2c8);
          uVar22 = local_1c8.field_2._M_allocated_capacity;
          uVar24 = local_1c8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_0023a5dd;
        }
        else {
          local_1a8._M_allocated_capacity = (size_type)&local_198;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,uVar22,(char *)(uVar24 + uVar22));
          detail::split_up(&local_2c8,(string *)&local_1a8,(char)local_28c);
          local_348.field_2._M_allocated_capacity =
               (size_type)
               local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_348._M_string_length =
               (size_type)
               local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_348._M_dataplus._M_p =
               (pointer)local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          pCVar26 = local_308;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_2c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_2c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_2c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_348);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2c8);
          uVar22 = local_198._M_allocated_capacity;
          uVar24 = local_1a8._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_allocated_capacity != &local_198) goto LAB_0023a5dd;
        }
        goto LAB_00239036;
      }
LAB_00239ab7:
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_348,uVar22,(char *)(uVar24 + uVar22));
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8,
                 &local_348,&local_328);
      goto LAB_0023a5c6;
    }
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    local_348._M_string_length = 0;
    local_348.field_2._M_allocated_capacity =
         local_348.field_2._M_allocated_capacity & 0xffffffffffffff00;
    while (local_284 != ((char *)(local_328._M_allocated_capacity - 1))[local_328._8_8_]) {
      cVar9 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar2);
      piVar13 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)input,(string *)&local_348,cVar9);
      if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) break;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(local_348._M_dataplus._M_p + local_348._M_string_length);
      local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p;
      ::std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                (&local_240,&local_2c8,&local_238);
      local_348._M_string_length = (size_type)(local_240 + -(long)local_348._M_dataplus._M_p);
      *local_240 = 0;
      _Var16 = ::std::
               __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                         (local_348._M_dataplus._M_p,
                          local_348._M_dataplus._M_p + local_348._M_string_length);
      if (local_348._M_dataplus._M_p + local_348._M_string_length == _Var16._M_current) {
        local_348._M_string_length = 0;
        _Var23._M_p = local_348._M_dataplus._M_p;
      }
      else {
        pcVar27 = _Var16._M_current + -(long)local_348._M_dataplus._M_p;
        if (((char *)local_348._M_string_length != pcVar27 && pcVar27 != (char *)0x0) &&
           (sVar19 = local_348._M_string_length - (long)pcVar27, sVar19 != 0)) {
          if (sVar19 == 1) {
            *local_348._M_dataplus._M_p = local_348._M_dataplus._M_p[(long)pcVar27];
          }
          else {
            memmove(local_348._M_dataplus._M_p,local_348._M_dataplus._M_p + (long)pcVar27,sVar19);
          }
        }
        local_348._M_string_length = local_348._M_string_length - (long)pcVar27;
        _Var23._M_p = (pointer)(local_348._M_dataplus._M_p + local_348._M_string_length);
      }
      *_Var23._M_p = '\0';
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328,
                 local_348._M_dataplus._M_p,local_348._M_string_length);
    }
    pCVar26 = local_308;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if (local_284 == ((char *)(local_328._M_allocated_capacity - 1))[local_328._8_8_]) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328,1,
                 (size_type)(local_328._8_8_ + -2));
      detail::split_up(&local_2c8,(string *)&local_128,(char)local_28c);
      local_348.field_2._M_allocated_capacity =
           (size_type)
           local_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_348._M_string_length =
           (size_type)
           local_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_348._M_dataplus._M_p =
           (pointer)local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_2c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_2c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_2c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_348);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2c8);
      uVar22 = local_118._M_allocated_capacity;
      uVar24 = local_128._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_allocated_capacity == &local_118) goto LAB_00239036;
      goto LAB_0023a5dd;
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_148,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328,1,
               0xffffffffffffffff);
    detail::split_up(&local_2c8,(string *)&local_148,(char)local_28c);
    local_348.field_2._M_allocated_capacity =
         (size_type)
         local_2a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_348._M_string_length =
         (size_type)
         local_2a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_348._M_dataplus._M_p =
         (pointer)local_2a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_2c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_2c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_348);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c8);
    uVar22 = local_148.field_2._M_allocated_capacity;
    uVar24 = local_148._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_0023a5dd;
  }
LAB_00239036:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_allocated_capacity != &local_318) {
    operator_delete((void *)local_328._M_allocated_capacity,
                    (ulong)(local_318._M_allocated_capacity + 1));
  }
  local_348._M_dataplus._M_p = (pointer)0x0;
  local_348._M_string_length = 0;
  local_348.field_2._M_allocated_capacity = 0;
  detail::generate_parents(&local_2c8,&local_260,(string *)&local_280,pCVar26->parentSeparatorChar);
  local_318._M_allocated_capacity = local_348.field_2._M_allocated_capacity;
  local_328._8_8_ = local_348._M_string_length;
  local_328._M_allocated_capacity = (size_type)local_348._M_dataplus._M_p;
  local_348.field_2._M_allocated_capacity =
       (size_type)
       local_2c8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_348._M_dataplus._M_p =
       (pointer)local_2c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_348._M_string_length =
       (size_type)
       local_2c8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_328);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  detail::process_quoted_string((string *)&local_280,'\"','\'');
  pbVar28 = local_2a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __return_storage_ptr__ = local_300,
      _Var23._M_p = local_348._M_dataplus._M_p,
      paVar20 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pbVar28; paVar20 = paVar20 + 2) {
    detail::process_quoted_string((string *)paVar20,local_308->stringQuote,local_308->literalQuote);
  }
  if ((ulong)local_308->maximumLayers <
      (ulong)((long)(local_348._M_string_length - (long)local_348._M_dataplus._M_p) >> 5))
  goto LAB_00239bcf;
  sVar19 = (local_308->configSection)._M_string_length;
  if (sVar19 == 0 || (local_2f4 & 1) != 0) {
LAB_00239458:
    pCVar5 = (__return_storage_ptr__->
             super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (((((__return_storage_ptr__->
           super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
           super__Vector_impl_data._M_start == pCVar5) ||
         (local_280._M_string_length != pCVar5[-1].name._M_string_length)) ||
        ((local_280._M_string_length != 0 &&
         (iVar12 = bcmp(local_280._M_dataplus._M_p,pCVar5[-1].name._M_dataplus._M_p,
                        local_280._M_string_length), iVar12 != 0)))) ||
       ((__first2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    pCVar5[-1].parents.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        local_348._M_string_length - (long)local_348._M_dataplus._M_p !=
        (long)pCVar5[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)__first2 ||
        (bVar11 = ::std::__equal<false>::
                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_348._M_dataplus._M_p,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_348._M_string_length,__first2),
        __return_storage_ptr__ = local_300, !bVar11)))) {
      __return_storage_ptr__ = local_300;
      std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>(local_300);
      pCVar5 = (__return_storage_ptr__->
               super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_318._M_allocated_capacity =
           (size_type)
           pCVar5[-1].parents.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_328._M_allocated_capacity =
           (size_type)
           pCVar5[-1].parents.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_328._8_8_ =
           pCVar5[-1].parents.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pCVar5[-1].parents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_348._M_dataplus._M_p;
      pCVar5[-1].parents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_348._M_string_length;
      pCVar5[-1].parents.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_348.field_2._M_allocated_capacity;
      local_348._M_dataplus._M_p = (pointer)0x0;
      local_348._M_string_length = 0;
      local_348.field_2._M_allocated_capacity = 0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_328);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(__return_storage_ptr__->
                  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                  super__Vector_impl_data._M_finish[-1].name,&local_280);
      pCVar5 = (__return_storage_ptr__->
               super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_318._M_allocated_capacity =
           (size_type)
           pCVar5[-1].inputs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_328._M_allocated_capacity =
           (size_type)
           pCVar5[-1].inputs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_328._8_8_ =
           pCVar5[-1].inputs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pCVar5[-1].inputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pCVar5[-1].inputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pCVar5[-1].inputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_328);
    }
    else {
      pCVar5 = (local_300->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pCVar5[-1].inputs,
                 pCVar5[-1].inputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_2a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_2a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    if (((local_348._M_dataplus._M_p != (pointer)local_348._M_string_length) &&
        (*(size_type *)((long)local_348._M_dataplus._M_p + 8) == sVar19)) &&
       (iVar12 = bcmp(((_Alloc_hider *)local_348._M_dataplus._M_p)->_M_p,
                      (local_308->configSection)._M_dataplus._M_p,sVar19), iVar12 == 0)) {
      sVar3 = local_308->configIndex;
      if (local_288 == sVar3 || sVar3 < 0) {
        local_2f4 = (uint)CONCAT71((uint7)(uint3)(int3)(char)((ushort)sVar3 >> 8),1);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_348,(iterator)_Var23._M_p);
        goto LAB_00239458;
      }
    }
    local_2f4 = 0;
  }
LAB_00239bcf:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_348);
LAB_00238ec1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a8);
  goto LAB_00238e0f;
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string buffer;
    std::string currentSection = "default";
    std::string previousSection = "default";
    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    bool inSection{false};
    bool inMLineComment{false};
    bool inMLineValue{false};

    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;
    int currentSectionIndex{0};

    std::string line_sep_chars{parentSeparatorChar, commentChar, valueDelimiter};
    while(getline(input, buffer)) {
        std::vector<std::string> items_buffer;
        std::string name;
        line = detail::trim_copy(buffer);
        std::size_t len = line.length();
        // lines have to be at least 3 characters to have any meaning to CLI just skip the rest
        if(len < 3) {
            continue;
        }
        if(line.compare(0, 3, multiline_string_quote) == 0 || line.compare(0, 3, multiline_literal_quote) == 0) {
            inMLineComment = true;
            auto cchar = line.front();
            while(inMLineComment) {
                if(getline(input, line)) {
                    detail::trim(line);
                } else {
                    break;
                }
                if(detail::hasMLString(line, cchar)) {
                    inMLineComment = false;
                }
            }
            continue;
        }
        if(line.front() == '[' && line.back() == ']') {
            if(currentSection != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
                output.back().name = "--";
            }
            currentSection = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(currentSection.size() > 1 && currentSection.front() == '[' && currentSection.back() == ']') {
                currentSection = currentSection.substr(1, currentSection.size() - 2);
            }
            if(detail::to_lower(currentSection) == "default") {
                currentSection = "default";
            } else {
                detail::checkParentSegments(output, currentSection, parentSeparatorChar);
            }
            inSection = false;
            if(currentSection == previousSection) {
                ++currentSectionIndex;
            } else {
                currentSectionIndex = 0;
                previousSection = currentSection;
            }
            continue;
        }

        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }
        std::size_t search_start = 0;
        if(line.find_first_of("\"'`") != std::string::npos) {
            while(search_start < line.size()) {
                auto test_char = line[search_start];
                if(test_char == '\"' || test_char == '\'' || test_char == '`') {
                    search_start = detail::close_sequence(line, search_start, line[search_start]);
                    ++search_start;
                } else if(test_char == valueDelimiter || test_char == commentChar) {
                    --search_start;
                    break;
                } else if(test_char == ' ' || test_char == '\t' || test_char == parentSeparatorChar) {
                    ++search_start;
                } else {
                    search_start = line.find_first_of(line_sep_chars, search_start);
                }
            }
        }
        // Find = in string, split and recombine
        auto delimiter_pos = line.find_first_of(valueDelimiter, search_start + 1);
        auto comment_pos = line.find_first_of(commentChar, search_start);
        if(comment_pos < delimiter_pos) {
            delimiter_pos = std::string::npos;
        }
        if(delimiter_pos != std::string::npos) {

            name = detail::trim_copy(line.substr(0, delimiter_pos));
            std::string item = detail::trim_copy(line.substr(delimiter_pos + 1, std::string::npos));
            bool mlquote =
                (item.compare(0, 3, multiline_literal_quote) == 0 || item.compare(0, 3, multiline_string_quote) == 0);
            if(!mlquote && comment_pos != std::string::npos) {
                auto citems = detail::split_up(item, commentChar);
                item = detail::trim_copy(citems.front());
            }
            if(mlquote) {
                // mutliline string
                auto keyChar = item.front();
                item = buffer.substr(delimiter_pos + 1, std::string::npos);
                detail::ltrim(item);
                item.erase(0, 3);
                inMLineValue = true;
                bool lineExtension{false};
                bool firstLine = true;
                if(!item.empty() && item.back() == '\\') {
                    item.pop_back();
                    lineExtension = true;
                } else if(detail::hasMLString(item, keyChar)) {
                    // deal with the first line closing the multiline literal
                    item.pop_back();
                    item.pop_back();
                    item.pop_back();
                    if(keyChar == '\"') {
                        try {
                            item = detail::remove_escaped_characters(item);
                        } catch(const std::invalid_argument &iarg) {
                            throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                        }
                    }
                    inMLineValue = false;
                }
                while(inMLineValue) {
                    std::string l2;
                    if(!std::getline(input, l2)) {
                        break;
                    }
                    line = l2;
                    detail::rtrim(line);
                    if(detail::hasMLString(line, keyChar)) {
                        line.pop_back();
                        line.pop_back();
                        line.pop_back();
                        if(lineExtension) {
                            detail::ltrim(line);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        firstLine = false;
                        item += line;
                        inMLineValue = false;
                        if(!item.empty() && item.back() == '\n') {
                            item.pop_back();
                        }
                        if(keyChar == '\"') {
                            try {
                                item = detail::remove_escaped_characters(item);
                            } catch(const std::invalid_argument &iarg) {
                                throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                            }
                        }
                    } else {
                        if(lineExtension) {
                            detail::trim(l2);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        lineExtension = false;
                        firstLine = false;
                        if(!l2.empty() && l2.back() == '\\') {
                            lineExtension = true;
                            l2.pop_back();
                        }
                        item += l2;
                    }
                }
                items_buffer = {item};
            } else if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                if(item.back() == aEnd) {
                    items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
                } else {
                    items_buffer = detail::split_up(item.substr(1, std::string::npos), aSep);
                }
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item, '\0');
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line.substr(0, comment_pos));
            items_buffer = {"true"};
        }
        std::vector<std::string> parents;
        try {
            parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
            detail::process_quoted_string(name);
            // clean up quotes on the items and check for escaped strings
            for(auto &it : items_buffer) {
                detail::process_quoted_string(it, stringQuote, literalQuote);
            }
        } catch(const std::invalid_argument &ia) {
            throw CLI::ParseError(ia.what(), CLI::ExitCodes::InvalidError);
        }

        if(parents.size() > maximumLayers) {
            continue;
        }
        if(!configSection.empty() && !inSection) {
            if(parents.empty() || parents.front() != configSection) {
                continue;
            }
            if(configIndex >= 0 && currentSectionIndex != configIndex) {
                continue;
            }
            parents.erase(parents.begin());
            inSection = true;
        }
        if(!output.empty() && name == output.back().name && parents == output.back().parents) {
            output.back().inputs.insert(output.back().inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(currentSection != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(currentSection, ename, parentSeparatorChar);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}